

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

int Fx_ManDivFindCubeFree(Vec_Int_t *vArr1,Vec_Int_t *vArr2,Vec_Int_t *vCubeFree,int *fWarning)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int local_70;
  int t;
  int Lit1;
  int Lit0;
  int *pArray;
  int local_58;
  int fAttr1;
  int fAttr0;
  int Counter;
  int *pEnd2;
  int *pEnd1;
  int *pBeg2;
  int *pBeg1;
  int *fWarning_local;
  Vec_Int_t *vCubeFree_local;
  Vec_Int_t *vArr2_local;
  Vec_Int_t *vArr1_local;
  
  piVar3 = Vec_IntArray(vArr1);
  piVar4 = Vec_IntArray(vArr2);
  piVar5 = Vec_IntLimit(vArr1);
  piVar6 = Vec_IntLimit(vArr2);
  fAttr1 = 0;
  local_58 = 0;
  pArray._4_4_ = 1;
  Vec_IntClear(vCubeFree);
  pEnd1 = piVar4 + 1;
  pBeg2 = piVar3 + 1;
  while (pBeg2 < piVar5 && pEnd1 < piVar6) {
    if (*pBeg2 == *pEnd1) {
      fAttr1 = fAttr1 + 1;
      pEnd1 = pEnd1 + 1;
      pBeg2 = pBeg2 + 1;
    }
    else if (*pBeg2 < *pEnd1) {
      iVar1 = Abc_Var2Lit(*pBeg2,local_58);
      Vec_IntPush(vCubeFree,iVar1);
      pBeg2 = pBeg2 + 1;
    }
    else {
      iVar1 = Vec_IntSize(vCubeFree);
      if (iVar1 == 0) {
        local_58 = 1;
        pArray._4_4_ = 0;
      }
      iVar1 = Abc_Var2Lit(*pEnd1,pArray._4_4_);
      Vec_IntPush(vCubeFree,iVar1);
      pEnd1 = pEnd1 + 1;
    }
  }
  while (pBeg2 < piVar5) {
    iVar1 = Abc_Var2Lit(*pBeg2,local_58);
    Vec_IntPush(vCubeFree,iVar1);
    pBeg2 = pBeg2 + 1;
  }
  while (pEnd1 < piVar6) {
    iVar1 = Abc_Var2Lit(*pEnd1,pArray._4_4_);
    Vec_IntPush(vCubeFree,iVar1);
    pEnd1 = pEnd1 + 1;
  }
  iVar1 = Vec_IntSize(vCubeFree);
  if (iVar1 == 0) {
    printf("The SOP has duplicated cubes.\n");
  }
  else {
    iVar1 = Vec_IntSize(vCubeFree);
    if (iVar1 == 1) {
      return -1;
    }
    iVar1 = Vec_IntSize(vCubeFree);
    if (iVar1 == 3) {
      piVar3 = Vec_IntArray(vCubeFree);
      iVar1 = Abc_Lit2Var(*piVar3);
      iVar2 = Abc_Lit2Var(piVar3[1]);
      iVar2 = Abc_LitNot(iVar2);
      if (iVar1 == iVar2) {
        iVar1 = Abc_LitIsCompl(*piVar3);
        iVar2 = Abc_LitIsCompl(piVar3[2]);
        if (iVar1 == iVar2) {
          Vec_IntDrop(vCubeFree,0);
        }
        else {
          Vec_IntDrop(vCubeFree,1);
        }
      }
      else {
        iVar1 = Abc_Lit2Var(piVar3[1]);
        iVar2 = Abc_Lit2Var(piVar3[2]);
        iVar2 = Abc_LitNot(iVar2);
        if (iVar1 == iVar2) {
          iVar1 = Abc_LitIsCompl(piVar3[1]);
          iVar2 = Abc_LitIsCompl(*piVar3);
          if (iVar1 == iVar2) {
            Vec_IntDrop(vCubeFree,1);
          }
          else {
            Vec_IntDrop(vCubeFree,2);
          }
        }
      }
      iVar1 = Vec_IntSize(vCubeFree);
      if (iVar1 == 2) {
        t = Abc_Lit2Var(*piVar3);
        iVar1 = Abc_Lit2Var(piVar3[1]);
        local_70 = iVar1;
        if (iVar1 < t) {
          local_70 = t;
          t = iVar1;
        }
        iVar1 = Abc_Var2Lit(t,0);
        Vec_IntWriteEntry(vCubeFree,0,iVar1);
        iVar1 = Abc_Var2Lit(local_70,1);
        Vec_IntWriteEntry(vCubeFree,1,iVar1);
      }
    }
  }
  iVar1 = Vec_IntEntry(vCubeFree,0);
  iVar1 = Abc_LitIsCompl(iVar1);
  if (iVar1 == 0) {
    return fAttr1;
  }
  __assert_fail("!Abc_LitIsCompl(Vec_IntEntry(vCubeFree, 0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                ,0x277,"int Fx_ManDivFindCubeFree(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int *)");
}

Assistant:

int Fx_ManDivFindCubeFree( Vec_Int_t * vArr1, Vec_Int_t * vArr2, Vec_Int_t * vCubeFree, int * fWarning )
{
    int * pBeg1 = Vec_IntArray( vArr1 ) + 1;  // skip variable ID
    int * pBeg2 = Vec_IntArray( vArr2 ) + 1;  // skip variable ID
    int * pEnd1 = Vec_IntLimit( vArr1 );
    int * pEnd2 = Vec_IntLimit( vArr2 );
    int Counter = 0, fAttr0 = 0, fAttr1 = 1;
    Vec_IntClear( vCubeFree );
    while ( pBeg1 < pEnd1 && pBeg2 < pEnd2 )
    {
        if ( *pBeg1 == *pBeg2 )
            pBeg1++, pBeg2++, Counter++;
        else if ( *pBeg1 < *pBeg2 )
            Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg1++, fAttr0) );
        else  
        {
            if ( Vec_IntSize(vCubeFree) == 0 )
                fAttr0 = 1, fAttr1 = 0;
            Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg2++, fAttr1) );
        }
    }
    while ( pBeg1 < pEnd1 )
        Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg1++, fAttr0) );
    while ( pBeg2 < pEnd2 )
        Vec_IntPush( vCubeFree, Abc_Var2Lit(*pBeg2++, fAttr1) );
    if ( Vec_IntSize(vCubeFree) == 0 )
        printf( "The SOP has duplicated cubes.\n" );
    else if ( Vec_IntSize(vCubeFree) == 1 )
        return -1;
    else if ( Vec_IntSize( vCubeFree ) == 3 )
    {
        int * pArray = Vec_IntArray( vCubeFree ); 

        if ( Abc_Lit2Var( pArray[0] ) == Abc_LitNot( Abc_Lit2Var( pArray[1] ) ) )
        {
            if ( Abc_LitIsCompl( pArray[0] ) == Abc_LitIsCompl( pArray[2] ) )
                Vec_IntDrop( vCubeFree, 0 );
            else
                Vec_IntDrop( vCubeFree, 1 );
        }
        else if ( Abc_Lit2Var( pArray[1] ) == Abc_LitNot( Abc_Lit2Var( pArray[2] ) ) )
        {
            if ( Abc_LitIsCompl( pArray[1] ) == Abc_LitIsCompl( pArray[0] ) )
                Vec_IntDrop( vCubeFree, 1 );
            else
                Vec_IntDrop( vCubeFree, 2 );
        }

        if ( Vec_IntSize( vCubeFree ) == 2 )
        {
            int Lit0 = Abc_Lit2Var( pArray[0] ),
                Lit1 = Abc_Lit2Var( pArray[1] );

            if ( Lit0 > Lit1 )
                ABC_SWAP( int, Lit0, Lit1 );

            Vec_IntWriteEntry( vCubeFree, 0, Abc_Var2Lit( Lit0, 0 ) );
            Vec_IntWriteEntry( vCubeFree, 1, Abc_Var2Lit( Lit1, 1 ) );
        }
    }
    assert( !Abc_LitIsCompl(Vec_IntEntry(vCubeFree, 0)) );
    return Counter;
}